

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d3d.cpp
# Opt level: O3

Raster * rw::d3d::rasterCreate(Raster *raster)

{
  uint uVar1;
  int32 numlevels;
  undefined8 uVar2;
  void *pvVar3;
  Raster *pRVar4;
  uint32 usage;
  long lVar5;
  int iVar6;
  ulong uVar7;
  undefined4 uVar8;
  int iVar9;
  int32 height;
  int32 width;
  
  uVar1 = raster->format;
  if (uVar1 == 0) {
    if ((raster->type & 0xfffffffbU) == 0) {
      raster->format = 0x500;
      uVar1 = 0x500;
    }
    else {
      uVar1 = 0;
    }
LAB_00116809:
    uVar7 = (ulong)(uVar1 >> 4 & 0xf0);
    uVar8 = *(undefined4 *)(formatInfoRW + uVar7);
    iVar6 = *(int *)(formatInfoRW + uVar7 + 4);
  }
  else {
    if ((uVar1 & 0x6000) == 0) goto LAB_00116809;
    iVar6 = 8;
    uVar8 = 0x29;
  }
  usage = nativeRasterOffset;
  lVar5 = (long)(int)nativeRasterOffset;
  *(undefined4 *)((long)&raster->height + lVar5) = uVar8;
  iVar9 = iVar6 + 7;
  if (-1 < iVar6) {
    iVar9 = iVar6;
  }
  raster->depth = iVar6;
  *(int *)((long)&raster->depth + lVar5) = iVar9 >> 3;
  *(bool *)((long)&raster->stride + lVar5) = (0x2aU >> (uVar1 >> 8 & 0xf) & 1) != 0;
  iVar6 = raster->width;
  raster->stride = (iVar9 >> 3) * iVar6;
  *(bool *)((long)&raster->stride + lVar5 + 2) = (~uVar1 & 0x9000) == 0;
  pRVar4 = raster;
  if ((iVar6 == 0) || (raster->height == 0)) {
    *(byte *)&raster->flags = (byte)raster->flags | 0x80;
    raster->stride = 0;
    goto LAB_00116922;
  }
  if ((raster->flags & 0x80) != 0) goto LAB_00116922;
  if ((raster->type & 0xfffffffbU) != 0) {
    rasterCreate();
    return (Raster *)0x0;
  }
  lVar5 = (long)(int)nativeRasterOffset;
  if (*(int *)((long)&raster->height + lVar5) == 0x29) {
    usage = 0x149f38;
    allocLocation =
         "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/d3d/d3d.cpp line: 419"
    ;
    uVar2 = (*DAT_00149de8)(0x400,0x30b00);
    *(undefined8 *)((long)&raster->flags + lVar5) = uVar2;
  }
  numlevels = 0;
  if (*(char *)((long)&raster->stride + lVar5 + 2) == '\0') {
    width = raster->width;
    height = raster->height;
    numlevels = 1;
    if ((raster->format & 0x8000) != 0) {
      numlevels = Raster::calculateNumLevels(width,height);
      goto LAB_001168ec;
    }
  }
  else {
LAB_001168ec:
    width = raster->width;
    height = raster->height;
  }
  pvVar3 = createTexture(width,height,numlevels,usage,*(uint32 *)((long)&raster->height + lVar5));
  *(void **)((long)&raster->platform + lVar5) = pvVar3;
  if (pvVar3 == (void *)0x0) {
    rasterCreate();
    pRVar4 = (Raster *)0x0;
  }
LAB_00116922:
  raster->originalWidth = raster->width;
  raster->originalHeight = raster->height;
  raster->originalStride = raster->stride;
  raster->originalPixels = raster->pixels;
  return pRVar4;
}

Assistant:

Raster*
rasterCreate(Raster *raster)
{
	rasterSetFormat(raster);

	Raster *ret = raster;

	if(raster->width == 0 || raster->height == 0){
		raster->flags |= Raster::DONTALLOCATE;
		raster->stride = 0;
		goto ret;
	}
	if(raster->flags & Raster::DONTALLOCATE)
		goto ret;

	switch(raster->type){
	case Raster::NORMAL:
	case Raster::TEXTURE:
		ret = rasterCreateTexture(raster);
		break;

#ifdef RW_D3D9
	case Raster::CAMERATEXTURE:
		ret = rasterCreateCameraTexture(raster);
		break;
	case Raster::ZBUFFER:
		ret = rasterCreateZbuffer(raster);
		break;
	case Raster::CAMERA:
		ret = rasterCreateCamera(raster);
		break;
#endif

	default:
		RWERROR((ERR_INVRASTER));
		return nil;
	}

ret:
	raster->originalWidth = raster->width;
	raster->originalHeight = raster->height;
	raster->originalStride = raster->stride;
	raster->originalPixels = raster->pixels;
	return ret;
}